

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DocumentContextExtenderAdapter.h
# Opt level: O1

EStatusCode __thiscall
DocumentContextExtenderAdapter::OnFormXObjectWrite
          (DocumentContextExtenderAdapter *this,ObjectIDType inFormXObjectID,
          ObjectIDType inFormXObjectResourcesDictionaryID,DictionaryContext *inFormDictionaryContext
          ,ObjectsContext *inPDFWriterObjectContext,DocumentContext *inDocumentContext)

{
  return eSuccess;
}

Assistant:

virtual PDFHummus::EStatusCode OnFormXObjectWrite(
							ObjectIDType inFormXObjectID,
							ObjectIDType inFormXObjectResourcesDictionaryID,
							DictionaryContext* inFormDictionaryContext,
							ObjectsContext* inPDFWriterObjectContext,
							PDFHummus::DocumentContext* inDocumentContext){
	  (void) inFormXObjectID;
	  (void) inFormXObjectResourcesDictionaryID;
	  (void) inFormDictionaryContext;
	  (void) inPDFWriterObjectContext;
	  (void) inDocumentContext;
	  return PDFHummus::eSuccess;}